

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase555::run(TestCase555 *this)

{
  PromiseArena *pPVar1;
  undefined1 auVar2 [8];
  Fault node;
  Fault node_00;
  int iVar3;
  uint uVar4;
  ssize_t sVar5;
  void *pvVar6;
  ulong uVar7;
  nfds_t __nfds;
  nfds_t __nfds_00;
  PromiseNode *ptrCopy;
  EventLoop *this_00;
  Exception *this_01;
  pollfd *ppVar8;
  bool writable;
  OwnFd outfd;
  OwnFd infd;
  Fault f_2;
  Fault f_1;
  int pipefds [2];
  WaitScope waitScope;
  FdObserver observer;
  EventLoop loop;
  UnixEventPort port;
  char buffer [4096];
  undefined1 local_1241;
  OwnFd local_1240;
  OwnFd local_123c;
  undefined1 local_1238 [8];
  Fault local_1230;
  Fault local_1228;
  PromiseFulfiller<void> *pPStack_1220;
  undefined8 local_1218;
  EventLoop *local_1210;
  byte local_1208 [8];
  PromiseFulfiller<void> *local_1200;
  Disposer *pDStack_11f8;
  FdObserver local_11f0;
  EventLoop local_1198;
  UnixEventPort local_1120;
  SourceLocation local_1028 [170];
  
  captureSignals();
  UnixEventPort::UnixEventPort(&local_1120);
  this_00 = &local_1198;
  EventLoop::EventLoop(this_00,&local_1120.super_EventPort);
  local_1208[0] = 0xff;
  local_1208[1] = 0xff;
  local_1208[2] = 0xff;
  local_1208[3] = 0xff;
  local_1200 = (PromiseFulfiller<void> *)0x0;
  pDStack_11f8 = (Disposer *)0x0;
  local_1210 = this_00;
  EventLoop::enterScope(this_00);
  local_1218 = (Disposer *)0x0;
  do {
    iVar3 = ::pipe((int *)&local_1218);
    if (-1 < iVar3) {
      iVar3 = 0;
      break;
    }
    uVar4 = kj::_::Debug::getOsErrorNumber(false);
    this_00 = (EventLoop *)((ulong)this_00 & 0xffffffff);
    if (uVar4 != 0xffffffff) {
      this_00 = (EventLoop *)(ulong)uVar4;
    }
    iVar3 = (int)this_00;
  } while (uVar4 == 0xffffffff);
  if (iVar3 != 0) {
    local_11f0.eventPort = (UnixEventPort *)0x0;
    local_1028[0].fileName = (char *)0x0;
    local_1028[0].function = (char *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_11f0,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_11f0);
  }
  local_123c.fd = (int)local_1218;
  local_1240.fd = local_1218._4_4_;
  setNonblocking(local_1218._4_4_);
  setNonblocking(local_123c.fd);
  UnixEventPort::FdObserver::FdObserver(&local_11f0,&local_1120,local_1240.fd,2);
LAB_001e5769:
  do {
    sVar5 = ::write(local_1240.fd,"foo",3);
    iVar3 = 0;
    if (sVar5 < 0) {
      iVar3 = kj::_::Debug::getOsErrorNumber(true);
      if (iVar3 == -1) goto LAB_001e5769;
    }
    if (iVar3 != 0) {
      local_1228.exception = (Exception *)0x0;
      local_1028[0].fileName = (char *)0x0;
      local_1028[0].function = (char *)0x0;
      kj::_::Debug::Fault::init
                (&local_1228,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                );
      kj::_::Debug::Fault::fatal(&local_1228);
    }
  } while (-1 < sVar5);
  local_1241 = '\0';
  UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_1238);
  auVar2 = local_1238;
  pPVar1 = (PromiseArena *)
           ((SleepHooks *)&((PromiseArenaMember *)local_1238)->arena)->_vptr_SleepHooks;
  uVar7 = (long)local_1238 - (long)pPVar1;
  iVar3 = (int)CONCAT71((int7)(uVar7 >> 8),0x27 < uVar7);
  if (pPVar1 != (PromiseArena *)0x0 && 0x27 < uVar7) {
    ((SleepHooks *)&((PromiseArenaMember *)local_1238)->arena)->_vptr_SleepHooks = (_func_int **)0x0
    ;
    this_01 = (Exception *)&((PromiseArenaMember *)((long)local_1238 + -0x30))->arena;
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_01,(OwnPromiseNode *)local_1238,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:577:13)>
               ::anon_class_8_1_79db791e_for_func::operator());
    ((PromiseArenaMember *)((long)auVar2 + -0x30))->arena = (PromiseArena *)&PTR_destroy_0062e810;
    ((PromiseArenaMember *)((long)auVar2 + -0x10))->arena = (PromiseArena *)&local_1241;
    ((PromiseArenaMember *)((long)auVar2 + -0x20))->_vptr_PromiseArenaMember = (_func_int **)pPVar1;
  }
  else {
    pvVar6 = operator_new(0x400);
    this_01 = (Exception *)((long)pvVar6 + 0x3d8);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)this_01,(OwnPromiseNode *)local_1238,
               kj::_::
               SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++:577:13)>
               ::anon_class_8_1_79db791e_for_func::operator());
    *(undefined ***)((long)pvVar6 + 0x3d8) = &PTR_destroy_0062e810;
    *(undefined1 **)((long)pvVar6 + 0x3f8) = &local_1241;
    *(void **)((long)pvVar6 + 0x3e0) = pvVar6;
  }
  local_1028[0].fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
  ;
  local_1028[0].function = "run";
  local_1028[0].lineNumber = 0x240;
  local_1028[0].columnNumber = 0x12;
  local_1230.exception = this_01;
  kj::_::PromiseDisposer::
  appendPromise<kj::_::EagerPromiseNode<kj::_::Void>,kj::_::PromiseDisposer,kj::SourceLocation&>
            ((PromiseDisposer *)&local_1228,(OwnPromiseNode *)&local_1230,local_1028);
  node_00.exception = local_1228.exception;
  node.exception = local_1230.exception;
  if (local_1230.exception != (Exception *)0x0) {
    local_1230.exception = (Exception *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
  }
  auVar2 = local_1238;
  if (local_1238 != (undefined1  [8])0x0) {
    local_1238 = (undefined1  [8])0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar2);
  }
  ppVar8 = (pollfd *)0xffffffff;
  EventLoop::run(&local_1198,0xffffffff);
  UnixEventPort::poll(&local_1120,ppVar8,__nfds,iVar3);
  EventLoop::run(&local_1198,0xffffffff);
  local_1028[0].fileName = (char *)(CONCAT71(local_1028[0].fileName._1_7_,local_1241) ^ 1);
  if ((local_1241 != '\0') && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[29],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
               ,0x247,ERROR,"\"failed: expected \" \"!(writable)\", _kjCondition",
               (char (*) [29])"failed: expected !(writable)",(DebugExpression<bool> *)local_1028);
  }
  memset(local_1028,0,0x1000);
LAB_001e5966:
  do {
    sVar5 = read(local_123c.fd,local_1028,0x1000);
    iVar3 = 0;
    if (sVar5 < 0) {
      iVar3 = kj::_::Debug::getOsErrorNumber(true);
      if (iVar3 == -1) goto LAB_001e5966;
    }
    if (iVar3 != 0) {
      local_1230.exception = (Exception *)0x0;
      local_1228.exception = (Exception *)0x0;
      pPStack_1220 = (PromiseFulfiller<void> *)0x0;
      kj::_::Debug::Fault::init
                (&local_1230,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                );
      kj::_::Debug::Fault::fatal(&local_1230);
    }
    if (sVar5 < 1) {
      ppVar8 = (pollfd *)0xffffffff;
      EventLoop::run(&local_1198,0xffffffff);
      UnixEventPort::poll(&local_1120,ppVar8,__nfds_00,iVar3);
      EventLoop::run(&local_1198,0xffffffff);
      local_1228.exception = (Exception *)&local_1241;
      if ((local_1241 == '\0') && (kj::_::Debug::minSeverity < 3)) {
        kj::_::Debug::log<char_const(&)[26],kj::_::DebugExpression<bool&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix-test.c++"
                   ,0x256,ERROR,"\"failed: expected \" \"writable\", _kjCondition",
                   (char (*) [26])"failed: expected writable",(DebugExpression<bool_&> *)&local_1228
                  );
      }
      if (node_00.exception != (Exception *)0x0) {
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node_00.exception);
      }
      UnixEventPort::FdObserver::~FdObserver(&local_11f0);
      OwnFd::~OwnFd(&local_1240);
      OwnFd::~OwnFd(&local_123c);
      if (local_1200 == (PromiseFulfiller<void> *)0x0) {
        EventLoop::leaveScope(local_1210);
      }
      EventLoop::~EventLoop(&local_1198);
      UnixEventPort::~UnixEventPort(&local_1120);
      return;
    }
  } while( true );
}

Assistant:

TEST(AsyncUnixTest, WriteObserver) {
  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  int pipefds[2]{};
  KJ_SYSCALL(pipe(pipefds));
  kj::OwnFd infd(pipefds[0]), outfd(pipefds[1]);
  setNonblocking(outfd);
  setNonblocking(infd);

  UnixEventPort::FdObserver observer(port, outfd, UnixEventPort::FdObserver::OBSERVE_WRITE);

  // Fill buffer.
  ssize_t n;
  do {
    KJ_NONBLOCKING_SYSCALL(n = write(outfd, "foo", 3));
  } while (n >= 0);

  bool writable = false;
  auto promise = observer.whenBecomesWritable()
      .then([&]() { writable = true; }).eagerlyEvaluate(nullptr);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_FALSE(writable);

  // Empty the read end so that the write end becomes writable. Note that Linux implements a
  // high watermark / low watermark heuristic which means that only reading one byte is not
  // sufficient. The amount we have to read is in fact architecture-dependent -- it appears to be
  // 1 page. To be safe, we read everything.
  char buffer[4096]{};
  do {
    KJ_NONBLOCKING_SYSCALL(n = read(infd, &buffer, sizeof(buffer)));
  } while (n > 0);

  loop.run();
  port.poll();
  loop.run();

  EXPECT_TRUE(writable);
}